

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.hpp
# Opt level: O0

void write<unsigned_int>(vector<unsigned_int,_std::allocator<unsigned_int>_> *v,ostream *stream)

{
  uint64_t uVar1;
  char *pcVar2;
  uint *puVar3;
  size_type local_20;
  uint64_t size;
  ostream *stream_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v_local;
  
  size = (uint64_t)stream;
  stream_local = (ostream *)v;
  pcVar2 = SerializationTraits<unsigned_int>::VectorTag();
  std::ostream::write((char *)stream,(long)pcVar2);
  local_20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)stream_local);
  swapEndianness(&local_20);
  std::ostream::write((char *)size,(long)&local_20);
  uVar1 = size;
  puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)stream_local);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)stream_local);
  std::ostream::write((char *)uVar1,(long)puVar3);
  return;
}

Assistant:

void write(const std::vector<T> & v, std::ostream & stream)
{
  static_assert(SerializationTraits<T>::IsSerializable, "write(): Vector element type is not serializable");

  // Write TAG(4B), SIZE(8B), VALUES...
  stream.write(SerializationTraits<T>::VectorTag(), 4);
  std::uint64_t size = v.size();
  swapEndianness(size);
  stream.write(reinterpret_cast<char *>(&size), sizeof(size));

  if (SerializationTraits<T>::IsEndiannessDependent) {
#ifdef IS_BIG_ENDIAN
    std::vector<T> duplicate = v;
    for (T & value : duplicate) {
      swapEndianness(value);
    }
    stream.write(duplicate.data(), duplicate.size() * sizeof(T));
#else
    stream.write(reinterpret_cast<const char *>(v.data()), v.size() * sizeof(T));
#endif
  } else {
    stream.write(reinterpret_cast<const char *>(v.data()), v.size() * sizeof(T));
  }
}